

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::init
          (BinaryAtomicOperationCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  ContextType ctxType;
  int extraout_EAX;
  NotSupportedError *this_00;
  string local_40;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_shader_image_atomic")
  ;
  if (!bVar2) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Test requires OES_shader_image_atomic extension","");
      tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pCVar1 = (this->super_TestCase).m_context;
  checkTextureTypeExtensions(pCVar1->m_contextInfo,this->m_imageType,pCVar1->m_renderCtx);
  return extraout_EAX;
}

Assistant:

void BinaryAtomicOperationCase::init (void)
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("Test requires OES_shader_image_atomic extension");

	checkTextureTypeExtensions(m_context.getContextInfo(), m_imageType, m_context.getRenderContext());
}